

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3PoslistCopy(char **pp,char **ppPoslist)

{
  void *__dest;
  int iVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  char *p;
  int n;
  char c;
  char *pEnd;
  byte local_19;
  byte *local_18;
  
  local_18 = (byte *)*in_RSI;
  local_19 = 0;
  for (; *local_18 != 0 || local_19 != 0; local_18 = local_18 + 1) {
    local_19 = *local_18 & 0x80;
  }
  if (in_RDI != (long *)0x0) {
    iVar1 = (int)(local_18 + 1) - (int)*in_RSI;
    __dest = (void *)*in_RDI;
    memcpy(__dest,(void *)*in_RSI,(long)iVar1);
    *in_RDI = (long)__dest + (long)iVar1;
  }
  *in_RSI = local_18 + 1;
  return;
}

Assistant:

static void fts3PoslistCopy(char **pp, char **ppPoslist){
  char *pEnd = *ppPoslist;
  char c = 0;

  /* The end of a position list is marked by a zero encoded as an FTS3
  ** varint. A single POS_END (0) byte. Except, if the 0 byte is preceded by
  ** a byte with the 0x80 bit set, then it is not a varint 0, but the tail
  ** of some other, multi-byte, value.
  **
  ** The following while-loop moves pEnd to point to the first byte that is not
  ** immediately preceded by a byte with the 0x80 bit set. Then increments
  ** pEnd once more so that it points to the byte immediately following the
  ** last byte in the position-list.
  */
  while( *pEnd | c ){
    c = *pEnd++ & 0x80;
    testcase( c!=0 && (*pEnd)==0 );
  }
  pEnd++;  /* Advance past the POS_END terminator byte */

  if( pp ){
    int n = (int)(pEnd - *ppPoslist);
    char *p = *pp;
    memcpy(p, *ppPoslist, n);
    p += n;
    *pp = p;
  }
  *ppPoslist = pEnd;
}